

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltablib.cpp
# Opt level: O2

int foreachi(lua_State *L)

{
  int iVar1;
  size_t sVar2;
  long n;
  ulong uVar3;
  
  luaL_checktype(L,1,5);
  sVar2 = lua_objlen(L,1);
  luaL_checktype(L,2,6);
  uVar3 = sVar2 & 0xffffffff;
  if ((int)sVar2 < 1) {
    uVar3 = 0;
  }
  n = 1;
  while( true ) {
    if (n - uVar3 == 1) {
      return 0;
    }
    lua_pushvalue(L,2);
    lua_pushinteger(L,n);
    lua_rawgeti(L,1,(int)n);
    lua_call(L,2,1);
    iVar1 = lua_type(L,-1);
    if (iVar1 != 0) break;
    lua_settop(L,-2);
    n = n + 1;
  }
  return 1;
}

Assistant:

static int foreachi (lua_State *L) {
  int i;
  int n = aux_getn(L, 1);
  luaL_checktype(L, 2, LUA_TFUNCTION);
  for (i=1; i <= n; i++) {
    lua_pushvalue(L, 2);  /* function */
    lua_pushinteger(L, i);  /* 1st argument */
    lua_rawgeti(L, 1, i);  /* 2nd argument */
    lua_call(L, 2, 1);
    if (!lua_isnil(L, -1))
      return 1;
    lua_pop(L, 1);  /* remove nil result */
  }
  return 0;
}